

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::RecordAllBigIntConstants(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  FuncInfo *this_00;
  anon_class_8_1_3e9b088b_for_fn fn;
  FunctionBody *byteCodeFunction;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  this_00 = TopFuncInfo(this);
  fn.byteCodeFunction = FuncInfo::GetParsedFunctionBody(this_00);
  JsUtil::
  BaseDictionary<ParseNode*,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::Map<ByteCodeGenerator::RecordAllBigIntConstants(FuncInfo*)::__0>
            ((BaseDictionary<ParseNode*,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)&funcInfo->bigintToRegister,fn);
  return;
}

Assistant:

void ByteCodeGenerator::RecordAllBigIntConstants(FuncInfo * funcInfo)
{
    Js::FunctionBody *byteCodeFunction = this->TopFuncInfo()->GetParsedFunctionBody();
    funcInfo->bigintToRegister.Map([byteCodeFunction](ParseNode* pnode, Js::RegSlot location)
    {
        IdentPtr pid = pnode->AsParseNodeBigInt()->pid;
        byteCodeFunction->RecordBigIntConstant(byteCodeFunction->MapRegSlot(location), pid->Psz(), pid->Cch(), pnode->AsParseNodeBigInt()->isNegative);
    });
}